

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

MempoolAcceptResult * __thiscall
anon_unknown.dwarf_2d68ce9::MemPoolAccept::AcceptSingleTransaction
          (MempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,CTransactionRef *ptx,
          ATMPArgs *args)

{
  setEntries *all_conflicts;
  CAmount *pCVar1;
  size_t *psVar2;
  uint height;
  element_type *peVar3;
  CTransaction *pCVar4;
  CTxMemPool *pCVar5;
  uint64_t mempool_sequence;
  ValidationSignals *this_00;
  CTxMemPoolEntry *this_01;
  TxValidationState state;
  TxValidationState state_00;
  TxValidationState state_01;
  TxValidationState state_02;
  TxValidationState state_03;
  TxValidationState state_04;
  TxValidationState state_05;
  TxValidationState state_06;
  int64_t vsize;
  bool bVar6;
  bool bVar7;
  bool chainstate_is_current;
  bool has_no_mempool_parents;
  int32_t iVar8;
  CFeeRate *pCVar9;
  _Base_ptr p_Var10;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *ws_00;
  Workspace *ws_01;
  Workspace *extraout_RDX_04;
  ValidationState<TxValidationResult> *this_02;
  long in_FS_OFFSET;
  initializer_list<transaction_identifier<true>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  string_view source_file;
  string_view logging_function;
  undefined8 uStack_578;
  uint local_570;
  undefined4 uStack_56c;
  undefined1 local_568;
  undefined7 uStack_567;
  Txid *local_560;
  CFeeRate local_558;
  CFeeRate local_550;
  CFeeRate local_548;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> single_wtxid;
  char *local_528;
  CFeeRate effective_feerate;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  ValidationState<TxValidationResult> local_4d8;
  ValidationState<TxValidationResult> local_490;
  ValidationState<TxValidationResult> local_448;
  ValidationState<TxValidationResult> local_400;
  ValidationState<TxValidationResult> local_3b8;
  ValidationState<TxValidationResult> local_370;
  ValidationState<TxValidationResult> local_328;
  ValidationState<TxValidationResult> local_2e0;
  Workspace ws;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock7,&this->m_pool->cs,"m_pool.cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x59b,false);
  Workspace::Workspace(&ws,ptx);
  peVar3 = ((ws.m_ptx)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       *(undefined8 *)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       *(undefined8 *)
        ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ =
       *(undefined8 *)
        ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ =
       *(undefined8 *)
        ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  __l._M_len = 1;
  __l._M_array = (iterator)&err_string;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            (&single_wtxid,__l,(allocator_type *)&local_58);
  bVar6 = PreChecks(this,args,&ws);
  if (bVar6) {
    ws_00 = extraout_RDX;
    if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged == true) {
      CFeeRate::CFeeRate((CFeeRate *)&err_string,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
      pCVar9 = std::optional<CFeeRate>::value(&args->m_client_maxfeerate);
      ws_00 = extraout_RDX_00;
      if (pCVar9->nSatoshisPerK <
          (long)err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err_string,"max feerate exceeded",
                   (allocator<char> *)&effective_feerate);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"",(allocator<char> *)&local_528);
        ValidationState<TxValidationResult>::Invalid
                  (&ws.m_state.super_ValidationState<TxValidationResult>,TX_MEMPOOL_POLICY,
                   (string *)&err_string,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&err_string);
        ValidationState<TxValidationResult>::ValidationState
                  (&local_370,&ws.m_state.super_ValidationState<TxValidationResult>);
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             local_570;
        state.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             uStack_56c;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_560;
        state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._0_16_;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state);
        this_02 = &local_370;
        goto LAB_008abea1;
      }
    }
    if ((this->m_subpackage).m_rbf == true) {
      pCVar4 = ((ws.m_ptx)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_568 = SUB81(pCVar4,0);
      uStack_567 = (undefined7)((ulong)pCVar4 >> 8);
      local_560 = ws.m_hash;
      CFeeRate::CFeeRate(&effective_feerate,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
      PaysMoreThanConflicts_abi_cxx11_
                (&err_string,&ws.m_iters_conflicting,effective_feerate,&(ws.m_hash)->m_wrapped);
      bVar6 = err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged;
      if (err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        local_528 = "";
        if (ws.m_sibling_eviction != false) {
          local_528 = " (including sibling eviction)";
        }
        tinyformat::format<char_const*>
                  (&local_58,(tinyformat *)"insufficient fee%s",(char *)&local_528,
                   (char **)" (including sibling eviction)");
        bVar7 = ValidationState<TxValidationResult>::Invalid
                          (&ws.m_state.super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,
                           &local_58,(string *)&err_string);
        local_570 = CONCAT31(local_570._1_3_,bVar7);
        std::__cxx11::string::~string((string *)&local_58);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&err_string);
      ws_00 = extraout_RDX_01;
      if (bVar6 == false) {
        all_conflicts = &(this->m_subpackage).m_all_conflicts;
        GetEntriesForConflicts_abi_cxx11_
                  (&err_string,pCVar4,this->m_pool,&ws.m_iters_conflicting,all_conflicts);
        bVar6 = err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_528 = "";
          if (ws.m_sibling_eviction != false) {
            local_528 = " (including sibling eviction)";
          }
          tinyformat::format<char_const*>
                    (&local_58,(tinyformat *)"too many potential replacements%s",(char *)&local_528,
                     (char **)" (including sibling eviction)");
          bVar7 = ValidationState<TxValidationResult>::Invalid
                            (&ws.m_state.super_ValidationState<TxValidationResult>,TX_MEMPOOL_POLICY
                             ,&local_58,(string *)&err_string);
          local_570 = CONCAT31(local_570._1_3_,bVar7);
          std::__cxx11::string::~string((string *)&local_58);
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&err_string);
        ws_00 = extraout_RDX_02;
        if (bVar6 != false) goto LAB_008ab9ca;
        HasNoNewUnconfirmed_abi_cxx11_(&err_string,pCVar4,this->m_pool,all_conflicts);
        bVar6 = err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_528 = "";
          if (ws.m_sibling_eviction != false) {
            local_528 = " (including sibling eviction)";
          }
          tinyformat::format<char_const*>
                    (&local_58,(tinyformat *)"replacement-adds-unconfirmed%s",(char *)&local_528,
                     (char **)" (including sibling eviction)");
          bVar7 = ValidationState<TxValidationResult>::Invalid
                            (&ws.m_state.super_ValidationState<TxValidationResult>,TX_MEMPOOL_POLICY
                             ,&local_58,(string *)&err_string);
          local_570 = CONCAT31(local_570._1_3_,bVar7);
          std::__cxx11::string::~string((string *)&local_58);
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&err_string);
        ws_00 = extraout_RDX_03;
        if (bVar6 != false) goto LAB_008ab9ca;
        for (p_Var10 = (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var10 !=
            &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          this_01 = *(CTxMemPoolEntry **)(p_Var10 + 1);
          pCVar1 = &(this->m_subpackage).m_conflicting_fees;
          *pCVar1 = *pCVar1 + this_01->m_modified_fee;
          iVar8 = CTxMemPoolEntry::GetTxSize(this_01);
          psVar2 = &(this->m_subpackage).m_conflicting_size;
          *psVar2 = *psVar2 + (long)iVar8;
        }
        PaysForRBF_abi_cxx11_
                  (&err_string,(this->m_subpackage).m_conflicting_fees,ws.m_modified_fees,
                   CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize),
                   (CFeeRate)(this->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK,
                   &(ws.m_hash)->m_wrapped);
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged != false) {
          local_528 = "";
          if (ws.m_sibling_eviction != false) {
            local_528 = " (including sibling eviction)";
          }
          tinyformat::format<char_const*>
                    (&local_58,(tinyformat *)"insufficient fee%s",(char *)&local_528,
                     (char **)" (including sibling eviction)");
          bVar6 = ValidationState<TxValidationResult>::Invalid
                            (&ws.m_state.super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE
                             ,&local_58,(string *)&err_string);
          local_570 = CONCAT31(local_570._1_3_,bVar6);
          std::__cxx11::string::~string((string *)&local_58);
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&err_string);
        ws_00 = extraout_RDX_04;
        if (((~err_string.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged | (byte)local_570) & 1) != 0) goto LAB_008ab9d6;
      }
      else {
LAB_008ab9ca:
        if ((local_570 & 1) != 0) goto LAB_008ab9d6;
      }
      if (ws.m_state.super_ValidationState<TxValidationResult>.m_result == TX_RECONSIDERABLE) {
        ValidationState<TxValidationResult>::ValidationState
                  (&local_3b8,&ws.m_state.super_ValidationState<TxValidationResult>);
        CFeeRate::CFeeRate(&local_550,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             local_570;
        state_04.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             uStack_56c;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)ws.m_hash;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._0_16_;
        MempoolAcceptResult::FeeFailure
                  (__return_storage_ptr__,state_04,(CFeeRate)&local_3b8,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)local_550.nSatoshisPerK);
        this_02 = &local_3b8;
      }
      else {
        ValidationState<TxValidationResult>::ValidationState
                  (&local_400,&ws.m_state.super_ValidationState<TxValidationResult>);
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             local_570;
        state_05.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             uStack_56c;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)ws.m_hash;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._0_16_;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state_05);
        this_02 = &local_400;
      }
    }
    else {
LAB_008ab9d6:
      bVar6 = PolicyScriptChecks(this,(ATMPArgs *)&ws,ws_00);
      if (bVar6) {
        bVar6 = ConsensusScriptChecks(this,(ATMPArgs *)&ws,ws_01);
        if (bVar6) {
          CFeeRate::CFeeRate(&effective_feerate,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
          if (args->m_test_accept != true) {
            bVar6 = Finalize(this,args,&ws);
            if (!bVar6) {
              ValidationState<TxValidationResult>::ValidationState
                        (&local_4d8,&ws.m_state.super_ValidationState<TxValidationResult>);
              CFeeRate::CFeeRate(&local_558,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
              peVar3 = ((ws.m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p =
                   (_Alloc_hider)
                   *(undefined8 *)
                    (peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length =
                   *(undefined8 *)
                    ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 8);
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ =
                   *(undefined8 *)
                    ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x10);
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_8_ =
                   *(undefined8 *)
                    ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x18);
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&err_string;
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)&local_58,__l_00,(allocator_type *)&local_528);
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p.
              _0_4_ = local_570;
              state_06.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p.
              _4_4_ = uStack_56c;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
              _0_1_ = local_568;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
              _1_7_ = uStack_567;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)local_560;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                   local_558.nSatoshisPerK;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                   (pointer)local_550.nSatoshisPerK;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
                   local_548.nSatoshisPerK;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )single_wtxid.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     ._M_impl.super__Vector_impl_data._0_16_;
              MempoolAcceptResult::FeeFailure
                        (__return_storage_ptr__,state_06,(CFeeRate)&local_4d8,
                         (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          *)local_558.nSatoshisPerK);
              std::
              _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ::~_Vector_base((_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                               *)&local_58);
              this_02 = &local_4d8;
              goto LAB_008abea1;
            }
            if ((this->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
              pCVar4 = ((ws.m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              vsize = CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize);
              height = *(uint *)((long)ws.m_entry._M_t.
                                       super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                                       .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl
                                + 0x98);
              bVar6 = args->m_bypass_limits;
              bVar7 = args->m_package_submission;
              chainstate_is_current = IsCurrentForFeeEstimation(this->m_active_chainstate);
              has_no_mempool_parents = CTxMemPool::HasNoInputsOf(this->m_pool,pCVar4);
              NewMempoolTransactionInfo::NewMempoolTransactionInfo
                        ((NewMempoolTransactionInfo *)&err_string,ws.m_ptx,&ws.m_base_fees,vsize,
                         height,bVar6,bVar7,chainstate_is_current,has_no_mempool_parents);
              pCVar5 = this->m_pool;
              mempool_sequence = pCVar5->m_sequence_number;
              this_00 = (pCVar5->m_opts).signals;
              pCVar5->m_sequence_number = mempool_sequence + 1;
              ValidationSignals::TransactionAddedToMempool
                        (this_00,(NewMempoolTransactionInfo *)&err_string,mempool_sequence);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &err_string.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length);
            }
            if (((this->m_subpackage).m_replaced_transactions.
                 super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next !=
                 (_List_node_base *)&(this->m_subpackage).m_replaced_transactions) &&
               (bVar6 = ::LogAcceptCategory(MEMPOOL,Debug), bVar6)) {
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p =
                   (_Alloc_hider)
                   (this->m_subpackage).m_replaced_transactions.
                   super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl._M_node._M_size;
              local_58._M_dataplus._M_p =
                   (pointer)(ws.m_modified_fees - (this->m_subpackage).m_conflicting_fees);
              local_528 = (char *)(CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize) -
                                  (long)(int)(this->m_subpackage).m_conflicting_size);
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file._M_len = 0x5e;
              logging_function._M_str = "AcceptSingleTransaction";
              logging_function._M_len = 0x17;
              LogPrintFormatInternal<unsigned_long,long,long>
                        (logging_function,source_file,0x5d8,MEMPOOL,Debug,
                         (ConstevalFormatString<3U>)0xcd49ce,(unsigned_long *)&err_string,
                         (long *)&local_58,(long *)&local_528);
            }
          }
          MempoolAcceptResult::MempoolAcceptResult
                    (__return_storage_ptr__,&(this->m_subpackage).m_replaced_transactions,
                     CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize),ws.m_base_fees,
                     effective_feerate,&single_wtxid);
          goto LAB_008abea6;
        }
        ValidationState<TxValidationResult>::ValidationState
                  (&local_490,&ws.m_state.super_ValidationState<TxValidationResult>);
        state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             local_570;
        state_03.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
        state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             uStack_56c;
        state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_560;
        state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._0_16_;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state_03);
        this_02 = &local_490;
      }
      else {
        ValidationState<TxValidationResult>::ValidationState
                  (&local_448,&ws.m_state.super_ValidationState<TxValidationResult>);
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
             local_570;
        state_02.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
             uStack_56c;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_560;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._0_16_;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state_02);
        this_02 = &local_448;
      }
    }
  }
  else if (ws.m_state.super_ValidationState<TxValidationResult>.m_result == TX_RECONSIDERABLE) {
    ValidationState<TxValidationResult>::ValidationState
              (&local_2e0,&ws.m_state.super_ValidationState<TxValidationResult>);
    CFeeRate::CFeeRate(&local_548,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
         local_570;
    state_00.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
         uStack_56c;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
         local_568;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
         uStack_567;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)local_560;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
         local_558.nSatoshisPerK;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)local_550.nSatoshisPerK;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
         local_548.nSatoshisPerK;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )single_wtxid.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._0_16_;
    MempoolAcceptResult::FeeFailure
              (__return_storage_ptr__,state_00,(CFeeRate)&local_2e0,
               (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                *)local_548.nSatoshisPerK);
    this_02 = &local_2e0;
  }
  else {
    ValidationState<TxValidationResult>::ValidationState
              (&local_328,&ws.m_state.super_ValidationState<TxValidationResult>);
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._0_4_ =
         local_570;
    state_01.super_ValidationState<TxValidationResult>._0_8_ = uStack_578;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p._4_4_ =
         uStack_56c;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
         local_568;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
         uStack_567;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)local_560;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
         local_558.nSatoshisPerK;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)local_550.nSatoshisPerK;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
         local_548.nSatoshisPerK;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )single_wtxid.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._0_16_;
    MempoolAcceptResult::Failure(__return_storage_ptr__,state_01);
    this_02 = &local_328;
  }
LAB_008abea1:
  ValidationState<TxValidationResult>::~ValidationState(this_02);
LAB_008abea6:
  std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
  ~_Vector_base(&single_wtxid.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               );
  Workspace::~Workspace(&ws);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

MempoolAcceptResult MemPoolAccept::AcceptSingleTransaction(const CTransactionRef& ptx, ATMPArgs& args)
{
    AssertLockHeld(cs_main);
    LOCK(m_pool.cs); // mempool "read lock" (held through m_pool.m_opts.signals->TransactionAddedToMempool())

    Workspace ws(ptx);
    const std::vector<Wtxid> single_wtxid{ws.m_ptx->GetWitnessHash()};

    if (!PreChecks(args, ws)) {
        if (ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // Failed for fee reasons. Provide the effective feerate and which tx was included.
            return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), single_wtxid);
        }
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    // Individual modified feerate exceeded caller-defined max; abort
    if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
        ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    if (m_subpackage.m_rbf && !ReplacementChecks(ws)) {
        if (ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // Failed for incentives-based fee reasons. Provide the effective feerate and which tx was included.
            return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), single_wtxid);
        }
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    // Perform the inexpensive checks first and avoid hashing and signature verification unless
    // those checks pass, to mitigate CPU exhaustion denial-of-service attacks.
    if (!PolicyScriptChecks(args, ws)) return MempoolAcceptResult::Failure(ws.m_state);

    if (!ConsensusScriptChecks(args, ws)) return MempoolAcceptResult::Failure(ws.m_state);

    const CFeeRate effective_feerate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
    // Tx was accepted, but not added
    if (args.m_test_accept) {
        return MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize,
                                            ws.m_base_fees, effective_feerate, single_wtxid);
    }

    if (!Finalize(args, ws)) {
        // The only possible failure reason is fee-related (mempool full).
        // Failed for fee reasons. Provide the effective feerate and which txns were included.
        Assume(ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE);
        return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), {ws.m_ptx->GetWitnessHash()});
    }

    if (m_pool.m_opts.signals) {
        const CTransaction& tx = *ws.m_ptx;
        const auto tx_info = NewMempoolTransactionInfo(ws.m_ptx, ws.m_base_fees,
                                                       ws.m_vsize, ws.m_entry->GetHeight(),
                                                       args.m_bypass_limits, args.m_package_submission,
                                                       IsCurrentForFeeEstimation(m_active_chainstate),
                                                       m_pool.HasNoInputsOf(tx));
        m_pool.m_opts.signals->TransactionAddedToMempool(tx_info, m_pool.GetAndIncrementSequence());
    }

    if (!m_subpackage.m_replaced_transactions.empty()) {
        LogDebug(BCLog::MEMPOOL, "replaced %u mempool transactions with 1 new transaction for %s additional fees, %d delta bytes\n",
                 m_subpackage.m_replaced_transactions.size(),
                 ws.m_modified_fees - m_subpackage.m_conflicting_fees,
                 ws.m_vsize - static_cast<int>(m_subpackage.m_conflicting_size));
    }

    return MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize, ws.m_base_fees,
                                        effective_feerate, single_wtxid);
}